

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

error_code llvm::sys::fs::copy_file_internal(int ReadFD,int WriteFD)

{
  int iVar1;
  void *__buf;
  ulong uVar2;
  ssize_t sVar3;
  error_category *peVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  error_code eVar8;
  
  __buf = operator_new__(0x1000);
  do {
    uVar2 = read(ReadFD,__buf,0x1000);
    uVar7 = (uint)uVar2;
    uVar2 = uVar2 & 0xffffffff;
    uVar6 = uVar7;
    if ((int)uVar7 < 1) break;
    do {
      uVar6 = (uint)uVar2;
      sVar3 = write(WriteFD,__buf,(long)(int)uVar6);
      iVar1 = (int)sVar3;
      if (iVar1 < 0) break;
      uVar6 = uVar6 - iVar1;
      uVar2 = (ulong)uVar6;
    } while (uVar6 != 0);
  } while (-1 < iVar1);
  operator_delete__(__buf);
  if (((int)uVar7 < 1) && (-1 < (int)uVar6)) {
    uVar6 = 0;
    peVar4 = (error_category *)std::_V2::system_category();
  }
  else {
    puVar5 = (uint *)__errno_location();
    uVar6 = *puVar5;
    peVar4 = (error_category *)std::_V2::generic_category();
  }
  eVar8._4_4_ = 0;
  eVar8._M_value = uVar6;
  eVar8._M_cat = peVar4;
  return eVar8;
}

Assistant:

static std::error_code copy_file_internal(int ReadFD, int WriteFD) {
  const size_t BufSize = 4096;
  char *Buf = new char[BufSize];
  int BytesRead = 0, BytesWritten = 0;
  for (;;) {
    BytesRead = read(ReadFD, Buf, BufSize);
    if (BytesRead <= 0)
      break;
    while (BytesRead) {
      BytesWritten = write(WriteFD, Buf, BytesRead);
      if (BytesWritten < 0)
        break;
      BytesRead -= BytesWritten;
    }
    if (BytesWritten < 0)
      break;
  }
  delete[] Buf;

  if (BytesRead < 0 || BytesWritten < 0)
    return std::error_code(errno, std::generic_category());
  return std::error_code();
}